

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

AssertionExpr * slang::ast::bindUnknownPortConn(ASTContext *context,PropertyExprSyntax *syntax)

{
  Compilation *args;
  bool bVar1;
  int iVar2;
  SimplePropertyExprSyntax *pSVar3;
  SyntaxNode *this;
  SimpleSequenceExprSyntax *pSVar4;
  ParenthesizedExpressionSyntax *pPVar5;
  Lookup *this_00;
  Compilation *this_01;
  Type *args_1;
  undefined4 extraout_var;
  LookupResult *in_R8;
  SourceRange local_258;
  HierarchicalReferenceExpression *local_248;
  HierarchicalReferenceExpression *hre;
  Compilation *comp;
  Symbol *symbol;
  undefined1 local_220 [8];
  LookupResult result;
  ExpressionSyntax *expr;
  SimpleSequenceExprSyntax *simpSeq;
  SyntaxNode *node;
  PropertyExprSyntax *syntax_local;
  ASTContext *context_local;
  
  if ((syntax->super_SyntaxNode).kind == SimplePropertyExpr) {
    pSVar3 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePropertyExprSyntax>
                       (&syntax->super_SyntaxNode);
    this = &not_null::operator_cast_to_SequenceExprSyntax_((not_null *)&pSVar3->expr)->
            super_SyntaxNode;
    if (this->kind == SimpleSequenceExpr) {
      pSVar4 = slang::syntax::SyntaxNode::as<slang::syntax::SimpleSequenceExprSyntax>(this);
      if (pSVar4->repetition == (SequenceRepetitionSyntax *)0x0) {
        result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.stackBase._104_8_ =
             not_null::operator_cast_to_ExpressionSyntax_((not_null *)&pSVar4->expr);
        while (*(int *)(result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.stackBase.
                        _104_8_ + 8) == 0x155) {
          pPVar5 = slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedExpressionSyntax>
                             ((SyntaxNode *)
                              result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.stackBase
                              ._104_8_);
          result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.stackBase._104_8_ =
               not_null::operator_cast_to_ExpressionSyntax_((not_null *)&pPVar5->expression);
        }
        bVar1 = slang::syntax::NameSyntax::isKind
                          (*(SyntaxKind *)
                            (result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.stackBase.
                             _104_8_ + 8));
        if (bVar1) {
          LookupResult::LookupResult((LookupResult *)local_220);
          this_00 = (Lookup *)
                    slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>
                              ((SyntaxNode *)
                               result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                               stackBase._104_8_);
          bitmask<slang::ast::LookupFlags>::bitmask
                    ((bitmask<slang::ast::LookupFlags> *)&symbol,None);
          Lookup::name(this_00,(NameSyntax *)context,(ASTContext *)(ulong)(uint)symbol,
                       (bitmask<slang::ast::LookupFlags>)(underlying_type)local_220,in_R8);
          if ((local_220 == (undefined1  [8])0x0) ||
             ((((comp = (Compilation *)local_220,
                *(int *)&((BumpAllocator *)local_220)->head != 0x2a &&
                (*(int *)&((BumpAllocator *)local_220)->head != 0x29)) &&
               (*(int *)&((BumpAllocator *)local_220)->head != 0x2d)) &&
              (*(int *)&((BumpAllocator *)local_220)->head != 0x2f)))) {
            bVar1 = false;
          }
          else {
            this_01 = ASTContext::getCompilation(context);
            args = comp;
            hre = (HierarchicalReferenceExpression *)this_01;
            args_1 = Compilation::getVoidType(this_01);
            local_258 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
            local_248 = BumpAllocator::
                        emplace<slang::ast::HierarchicalReferenceExpression,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::SourceRange>
                                  (&this_01->super_BumpAllocator,(Symbol *)args,args_1,&local_258);
            context_local =
                 (ASTContext *)
                 BumpAllocator::
                 emplace<slang::ast::SimpleAssertionExpr,slang::ast::HierarchicalReferenceExpression&,std::nullopt_t_const&>
                           ((BumpAllocator *)hre,local_248,(nullopt_t *)&std::nullopt);
            bVar1 = true;
          }
          LookupResult::~LookupResult((LookupResult *)local_220);
          if (bVar1) {
            return (AssertionExpr *)context_local;
          }
        }
      }
    }
  }
  iVar2 = AssertionExpr::bind((AssertionExpr *)syntax,(int)context,(sockaddr *)0x0,0);
  return (AssertionExpr *)CONCAT44(extraout_var,iVar2);
}

Assistant:

static const AssertionExpr* bindUnknownPortConn(const ASTContext& context,
                                                const PropertyExprSyntax& syntax) {
    // We have to check for a simple reference to an interface instance or port here,
    // since we don't know whether this is an interface port connection or even
    // a normal connection with a virtual interface type.
    const SyntaxNode* node = &syntax;
    if (node->kind == SyntaxKind::SimplePropertyExpr) {
        node = node->as<SimplePropertyExprSyntax>().expr;
        if (node->kind == SyntaxKind::SimpleSequenceExpr) {
            auto& simpSeq = node->as<SimpleSequenceExprSyntax>();
            if (!simpSeq.repetition) {
                const ExpressionSyntax* expr = simpSeq.expr;
                while (expr->kind == SyntaxKind::ParenthesizedExpression)
                    expr = expr->as<ParenthesizedExpressionSyntax>().expression;

                if (NameSyntax::isKind(expr->kind)) {
                    LookupResult result;
                    Lookup::name(expr->as<NameSyntax>(), context, LookupFlags::None, result);
                    if (result.found) {
                        auto symbol = result.found;
                        if (symbol->kind == SymbolKind::Modport ||
                            symbol->kind == SymbolKind::InterfacePort ||
                            symbol->kind == SymbolKind::Instance ||
                            symbol->kind == SymbolKind::InstanceArray) {
                            auto& comp = context.getCompilation();
                            auto hre = comp.emplace<HierarchicalReferenceExpression>(
                                *symbol, comp.getVoidType(), syntax.sourceRange());
                            return comp.emplace<SimpleAssertionExpr>(*hre, std::nullopt);
                        }
                    }
                }
            }
        }
    }

    return &AssertionExpr::bind(syntax, context);
}